

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[4]>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,char (*params) [7])

{
  char *pcVar1;
  ulong uVar2;
  void *__s1;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uint *puVar6;
  long lVar7;
  size_t sVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  ulong uVar11;
  ulong uVar12;
  StringPtr *pSVar13;
  uint uVar14;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar15;
  
  aVar9.value = table.size_;
  pSVar13 = table.ptr;
  aVar10.value = aVar9.value;
  if (pSVar13[1].content.size_ != 0) {
    sVar5 = strlen(*params);
    s.size_ = sVar5;
    s.ptr = (uchar *)params;
    uVar3 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    pcVar1 = pSVar13[1].content.ptr;
    uVar2 = pSVar13[1].content.size_;
    uVar12 = (ulong)((int)uVar2 - 1U & uVar3);
    uVar14 = *(uint *)(pcVar1 + uVar12 * 8 + 4);
    aVar10 = extraout_RDX;
    if (uVar14 != 0) {
      puVar6 = (uint *)(pcVar1 + uVar12 * 8);
      do {
        if ((uVar14 != 1) && (*puVar6 == uVar3)) {
          lVar7 = (ulong)(uVar14 - 2) * 0x10;
          __s1 = *(void **)(aVar9.value + lVar7);
          sVar5 = *(size_t *)(aVar9.value + 8 + lVar7);
          sVar8 = strlen(*params);
          aVar10 = extraout_RDX_00;
          if ((sVar5 == sVar8 + 1) &&
             ((sVar5 == 0 || (iVar4 = bcmp(__s1,params,sVar5), aVar10 = extraout_RDX_01, iVar4 == 0)
              ))) {
            *(undefined1 *)this = 1;
            this->erasedCount = (ulong)(uVar14 - 2);
            goto LAB_0015ad67;
          }
        }
        uVar11 = uVar12 + 1;
        uVar12 = uVar11 & 0xffffffff;
        if (uVar11 == uVar2) {
          uVar12 = 0;
        }
        puVar6 = (uint *)(pcVar1 + uVar12 * 8);
        uVar14 = puVar6[1];
      } while (uVar14 != 0);
    }
  }
  *(undefined1 *)this = 0;
LAB_0015ad67:
  MVar15.ptr.field_1.value = aVar10.value;
  MVar15.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar15.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }